

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O2

int archive_read_support_filter_lrzip(archive *_a)

{
  int iVar1;
  
  iVar1 = __archive_read_register_bidder
                    ((archive_read *)_a,(void *)0x0,"lrzip",&lrzip_bidder_vtable);
  if (iVar1 == 0) {
    archive_set_error(_a,-1,"Using external lrzip program for lrzip decompression");
    iVar1 = -0x14;
  }
  else {
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

int
archive_read_support_filter_lrzip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, "lrzip",
				&lrzip_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* This filter always uses an external program. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lrzip program for lrzip decompression");
	return (ARCHIVE_WARN);
}